

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool __thiscall
miniply::PLYReader::load_binary_scalar_property(PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  bool bVar1;
  ulong __n;
  uchar *puVar2;
  size_t numBytes;
  size_t *destIndex_local;
  PLYProperty *prop_local;
  PLYReader *this_local;
  
  __n = (ulong)*(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
  if ((this->m_pos + __n <= this->m_bufEnd) ||
     ((bVar1 = refill_buffer(this), bVar1 && (this->m_pos + __n <= this->m_bufEnd)))) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_elementData);
    memcpy(puVar2 + *destIndex,this->m_pos,__n);
    this->m_pos = this->m_pos + __n;
    this->m_end = this->m_pos;
    *destIndex = __n + *destIndex;
    this_local._7_1_ = true;
  }
  else {
    this->m_valid = false;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PLYReader::load_binary_scalar_property(PLYProperty& prop, size_t& destIndex)
  {
    size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];
    if (m_pos + numBytes > m_bufEnd) {
      if (!refill_buffer() || m_pos + numBytes > m_bufEnd) {
        m_valid = false;
        return false;
      }
    }
    std::memcpy(m_elementData.data() + destIndex, m_pos, numBytes);
    m_pos += numBytes;
    m_end = m_pos;
    destIndex += numBytes;
    return true;
  }